

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::anon_unknown_0::SwapBuffersWithDamageAndBufferAgeTest::iterate
          (SwapBuffersWithDamageAndBufferAgeTest *this)

{
  TestContext *this_00;
  EGLint numFrames;
  EGLint width;
  deUint32 dVar1;
  Library *egl;
  ostream *this_01;
  int in_R9D;
  float fVar2;
  float fVar3;
  float fVar4;
  int bufferAge;
  vector<int,_std::allocator<int>_> damageRegion;
  FrameSequence frameSequence;
  Random rnd;
  ostringstream stream;
  long *local_1f0;
  long local_1e0 [2];
  FrameSequence local_1d0;
  deRandom local_1b8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  deRandom_init(&local_1b8,(this->super_SwapBuffersWithDamageTest).m_seed);
  egl = EglTestContext::getLibrary
                  ((this->super_SwapBuffersWithDamageTest).super_TestCase.m_eglTestCtx);
  numFrames = eglu::querySurfaceInt
                        (egl,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
                         (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x3057);
  width = eglu::querySurfaceInt
                    (egl,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
                     (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x3056);
  fVar2 = deRandom_getFloat(&local_1b8);
  fVar3 = deRandom_getFloat(&local_1b8);
  fVar4 = deRandom_getFloat(&local_1b8);
  generateFrameSequence
            (&local_1d0,&(this->super_SwapBuffersWithDamageTest).m_frameDrawType,
             (Random *)&local_1b8,numFrames,width,in_R9D);
  tcu::TestContext::setTestResult
            ((this->super_SwapBuffersWithDamageTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  (*egl->_vptr_Library[0x30])
            (egl,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
             (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x3093,0x3095);
  dVar1 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar1,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                   ,0x243);
  if (0 < (this->super_SwapBuffersWithDamageTest).m_iterationTimes) {
    (*(this->super_SwapBuffersWithDamageTest).m_gl.clearColor)(fVar2,fVar3,fVar4,1.0);
    (*(this->super_SwapBuffersWithDamageTest).m_gl.clear)(0x4000);
    (*egl->_vptr_Library[0x32])
              (egl,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
               (this->super_SwapBuffersWithDamageTest).m_eglSurface,0,0);
    dVar1 = (*egl->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,"swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, DE_NULL, 0)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                     ,0x248);
    (*egl->_vptr_Library[0x2b])
              (egl,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
               (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x313d);
    dVar1 = (*egl->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,
                     "querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_EXT, &bufferAge)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                     ,0x251);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Fail, the age is invalid. Age: ",0x1f);
    this_01 = (ostream *)std::ostream::operator<<(local_1a8,-1);
    std::__ostream_insert<char,std::char_traits<char>>(this_01,", frameNdx: ",0xc);
    std::ostream::operator<<(this_01,0);
    this_00 = (this->super_SwapBuffersWithDamageTest).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    std::__cxx11::stringbuf::str();
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,(char *)local_1f0);
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::~vector(&local_1d0);
  return STOP;
}

Assistant:

TestCase::IterateResult SwapBuffersWithDamageAndBufferAgeTest::iterate (void)
{

	de::Random			rnd				(m_seed);
	const Library&		egl				= m_eglTestCtx.getLibrary();
	const int			width			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int			height			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);
	const float			clearRed		= rnd.getFloat();
	const float			clearGreen		= rnd.getFloat();
	const float			clearBlue		= rnd.getFloat();
	const tcu::Vec4		clearColor		(clearRed, clearGreen, clearBlue, 1.0f);
	const int			numFrames		= 24; // (width, height) = (480, 480) --> numFrame = 24, divisible
	const FrameSequence frameSequence	= generateFrameSequence(m_frameDrawType, rnd, numFrames, width, height);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));

	for (int iterationNdx = 0; iterationNdx < m_iterationTimes; iterationNdx++)
	{
		clearColorScreen(m_gl, clearColor);
		EGLU_CHECK_CALL(egl, swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, DE_NULL, 0));

		for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
		{
			vector<EGLint>	damageRegion;
			int				bufferAge		= -1;
			int				startFrameNdx	= -1;
			int				endFrameNdx		= frameNdx;

			EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_EXT, &bufferAge));

			if (bufferAge < 0) // invalid buffer age
			{
				std::ostringstream stream;
				stream << "Fail, the age is invalid. Age: " << bufferAge << ", frameNdx: " << frameNdx;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, stream.str().c_str());
				return STOP;
			}

			if (bufferAge == 0 || bufferAge > frameNdx)
			{
				clearColorScreen(m_gl, clearColor);
				startFrameNdx = 0;
			}
			else
				startFrameNdx = frameNdx-bufferAge+1;

			for (int ndx = startFrameNdx; ndx <= endFrameNdx; ndx++)
			{
				const vector<EGLint> partialDamageRegion = getDamageRegion(frameSequence[ndx]);

				damageRegion.insert(damageRegion.end(), partialDamageRegion.begin(), partialDamageRegion.end());
				m_gles2Renderer->render(width, height, frameSequence[ndx]);
			}

			if (m_resizeType == RESIZETYPE_BEFORE_SWAP)
			{
				if (iterationNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}

			EGLU_CHECK_CALL(egl, swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4));

			if (m_resizeType == RESIZETYPE_AFTER_SWAP)
			{
				if (iterationNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}
		}
	}
	return STOP;
}